

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qinputdialog.cpp
# Opt level: O0

void QInputDialog::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  QString *_t1;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  QInputDialog *_t;
  QInputDialog *in_stack_ffffffffffffff80;
  
  if (in_ESI == 0) {
    _t1 = (QString *)(ulong)in_EDX;
    switch(_t1) {
    case (QString *)0x0:
      textValueChanged(in_stack_ffffffffffffff80,_t1);
      break;
    case (QString *)0x1:
      textValueSelected(in_stack_ffffffffffffff80,_t1);
      break;
    case (QString *)0x2:
      intValueChanged((QInputDialog *)0x79e91e,0);
      break;
    case (QString *)0x3:
      intValueSelected((QInputDialog *)0x79e935,0);
      break;
    case (QString *)0x4:
      doubleValueChanged((QInputDialog *)0x79e94e,(double)_t1);
      break;
    case (QString *)0x5:
      doubleValueSelected((QInputDialog *)0x79e967,(double)_t1);
    }
  }
  if ((((in_ESI == 5) &&
       (bVar1 = QtMocHelpers::indexOfMethod<void(QInputDialog::*)(QString_const&)>
                          (in_RCX,(void **)textValueChanged,0,0), !bVar1)) &&
      (bVar1 = QtMocHelpers::indexOfMethod<void(QInputDialog::*)(QString_const&)>
                         (in_RCX,(void **)textValueSelected,0,1), !bVar1)) &&
     (((bVar1 = QtMocHelpers::indexOfMethod<void(QInputDialog::*)(int)>
                          (in_RCX,(void **)intValueChanged,0,2), !bVar1 &&
       (bVar1 = QtMocHelpers::indexOfMethod<void(QInputDialog::*)(int)>
                          (in_RCX,(void **)intValueSelected,0,3), !bVar1)) &&
      (bVar1 = QtMocHelpers::indexOfMethod<void(QInputDialog::*)(double)>
                         (in_RCX,(void **)doubleValueChanged,0,4), !bVar1)))) {
    QtMocHelpers::indexOfMethod<void(QInputDialog::*)(double)>
              (in_RCX,(void **)doubleValueSelected,0,5);
  }
  return;
}

Assistant:

void QInputDialog::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QInputDialog *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->textValueChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 1: _t->textValueSelected((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 2: _t->intValueChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 3: _t->intValueSelected((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 4: _t->doubleValueChanged((*reinterpret_cast< std::add_pointer_t<double>>(_a[1]))); break;
        case 5: _t->doubleValueSelected((*reinterpret_cast< std::add_pointer_t<double>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QInputDialog::*)(const QString & )>(_a, &QInputDialog::textValueChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QInputDialog::*)(const QString & )>(_a, &QInputDialog::textValueSelected, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QInputDialog::*)(int )>(_a, &QInputDialog::intValueChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QInputDialog::*)(int )>(_a, &QInputDialog::intValueSelected, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QInputDialog::*)(double )>(_a, &QInputDialog::doubleValueChanged, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QInputDialog::*)(double )>(_a, &QInputDialog::doubleValueSelected, 5))
            return;
    }
}